

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O1

void __thiscall
QWidgetTextControlPrivate::QWidgetTextControlPrivate(QWidgetTextControlPrivate *this)

{
  QObjectPrivate::QObjectPrivate(&this->super_QObjectPrivate,QObjectPrivateVersion);
  *(undefined ***)this = &PTR__QWidgetTextControlPrivate_0080d108;
  this->doc = (QTextDocument *)0x0;
  this->cursorOn = false;
  this->cursorVisible = false;
  QTextCursor::QTextCursor(&this->cursor);
  this->cursorIsFocusIndicator = false;
  QTextCharFormat::QTextCharFormat(&this->lastCharFormat);
  QTextCursor::QTextCursor(&this->dndFeedbackCursor);
  this->interactionFlags = (QFlagsStorageHelper<Qt::TextInteractionFlag,_4>)0x13;
  this->cursorBlinkTimer = Invalid;
  (this->trippleClickTimer).m_id = Invalid;
  (this->trippleClickPoint).xp = 0.0;
  (this->trippleClickPoint).yp = 0.0;
  this->dragEnabled = true;
  this->mousePressed = false;
  this->mightStartDrag = false;
  (this->mousePressPos).xp = 0;
  (this->mousePressPos).yp = 0;
  (this->contextWidget).wp.d = (Data *)0x0;
  (this->contextWidget).wp.value = (QObject *)0x0;
  *(undefined8 *)((long)&(this->contextWidget).wp.value + 1) = 0;
  *(undefined8 *)((long)&this->lastSelectionPosition + 1) = 0;
  QTextCursor::QTextCursor(&this->selectedWordOnDoubleClick);
  QTextCursor::QTextCursor(&this->selectedBlockOnTrippleClick);
  this->overwriteMode = false;
  this->acceptRichText = true;
  this->preeditCursor = 0;
  this->hideCursor = false;
  (this->extraSelections).d.d = (Data *)0x0;
  (this->extraSelections).d.ptr = (Selection *)0x0;
  (this->extraSelections).d.size = 0;
  QPalette::QPalette(&this->palette);
  this->hasFocus = false;
  this->isEnabled = true;
  (this->linkToCopy).d.d = (Data *)0x0;
  (this->linkToCopy).d.ptr = (char16_t *)0x0;
  (this->linkToCopy).d.size = 0;
  (this->highlightedAnchor).d.d = (Data *)0x0;
  (this->highlightedAnchor).d.ptr = (char16_t *)0x0;
  (this->highlightedAnchor).d.size = 0;
  (this->anchorOnMousePress).d.d = (Data *)0x0;
  (this->anchorOnMousePress).d.ptr = (char16_t *)0x0;
  (this->anchorOnMousePress).d.size = 0;
  *(undefined8 *)((long)&(this->anchorOnMousePress).d.size + 4) = 0;
  *(undefined8 *)((long)&(this->blockWithMarkerUnderMouse).p + 4) = 0;
  this->hadSelectionOnMousePress = false;
  this->ignoreUnusedNavigationEvents = false;
  this->openExternalLinks = false;
  this->wordSelectionEnabled = false;
  return;
}

Assistant:

QWidgetTextControlPrivate::QWidgetTextControlPrivate()
    : doc(nullptr), cursorOn(false), cursorVisible(false), cursorIsFocusIndicator(false),
#ifndef Q_OS_ANDROID
      interactionFlags(Qt::TextEditorInteraction),
#else
      interactionFlags(Qt::TextEditable | Qt::TextSelectableByKeyboard),
#endif
      dragEnabled(true),
#if QT_CONFIG(draganddrop)
      mousePressed(false), mightStartDrag(false),
#endif
      lastSelectionPosition(0), lastSelectionAnchor(0),
      ignoreAutomaticScrollbarAdjustement(false),
      overwriteMode(false),
      acceptRichText(true),
      preeditCursor(0), hideCursor(false),
      hasFocus(false),
#ifdef QT_KEYPAD_NAVIGATION
      hasEditFocus(false),
#endif
      isEnabled(true),
      hadSelectionOnMousePress(false),
      ignoreUnusedNavigationEvents(false),
      openExternalLinks(false),
      wordSelectionEnabled(false)
{}